

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O0

int __thiscall OctetType::fromBuffer(OctetType *this,uint8_t *buf,size_t max_len)

{
  uint8_t *ptr;
  int i;
  size_t max_len_local;
  uint8_t *buf_local;
  OctetType *this_local;
  
  this_local._4_4_ = BER_CONTAINER::fromBuffer(&this->super_BER_CONTAINER,buf,max_len);
  if (-1 < this_local._4_4_) {
    if ((this->super_BER_CONTAINER)._length < 0x1f5) {
      std::__cxx11::string::assign((char *)&this->_value,(ulong)(buf + this_local._4_4_));
      this_local._4_4_ = (this->super_BER_CONTAINER)._length + this_local._4_4_;
    }
    else {
      this_local._4_4_ = -0x10;
    }
  }
  return this_local._4_4_;
}

Assistant:

int OctetType::fromBuffer(const uint8_t *buf, size_t max_len){
    int i = BER_CONTAINER::fromBuffer(buf, max_len);
    CHECK_DECODE_ERR(i);
    const uint8_t* ptr = buf + i;
    if(_length > OCTET_TYPE_MAX_LENGTH) return SNMP_BUFFER_ERROR_OCTET_TOO_BIG;

    _value.assign((char*)ptr, _length);

    return _length + i;
}